

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<bssl::ParseNameConstraints_Rfc822NameHostnameWithAtInExcluded_Test>::
CreateTest(ParameterizedTestFactory<bssl::ParseNameConstraints_Rfc822NameHostnameWithAtInExcluded_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<bool>>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_006bb838;
  this_00[1]._vptr_Test =
       (_func_int **)&PTR__ParseNameConstraints_Rfc822NameHostnameWithAtInExcluded_Test_006bb878;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }